

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

bool __thiscall draco::PlyReader::ParsePropertiesData(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *in_RDI;
  int i;
  int in_stack_0000005c;
  DecoderBuffer *in_stack_00000060;
  PlyReader *in_stack_00000068;
  int in_stack_00000074;
  DecoderBuffer *in_stack_00000078;
  PlyReader *in_stack_00000080;
  int local_1c;
  
  local_1c = 0;
  do {
    sVar2 = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::size(in_RDI);
    if ((int)sVar2 <= local_1c) {
      return true;
    }
    if (*(int *)&in_RDI[3].super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0) {
      bVar1 = ParseElementData(in_stack_00000080,in_stack_00000078,in_stack_00000074);
      if (!bVar1) {
        return false;
      }
    }
    else if ((*(int *)&in_RDI[3].
                       super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
                       _M_impl.super__Vector_impl_data._M_start == 1) &&
            (bVar1 = ParseElementDataAscii(in_stack_00000068,in_stack_00000060,in_stack_0000005c),
            !bVar1)) {
      return false;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool PlyReader::ParsePropertiesData(DecoderBuffer *buffer) {
  for (int i = 0; i < static_cast<int>(elements_.size()); ++i) {
    if (format_ == kLittleEndian) {
      if (!ParseElementData(buffer, i)) {
        return false;
      }
    } else if (format_ == kAscii) {
      if (!ParseElementDataAscii(buffer, i)) {
        return false;
      }
    }
  }
  return true;
}